

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  uint __b;
  result_type_conflict1 rVar1;
  const_iterator piVar2;
  size_type sVar3;
  size_type sVar4;
  double dVar5;
  double error;
  int counter_result;
  int expected;
  result_type local_37d0;
  int local_37cc;
  int value;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> all;
  uniform_int_distribution<int> dis;
  int k;
  const_iterator __end1;
  const_iterator __begin1;
  undefined8 local_3770;
  undefined8 local_3768;
  undefined8 local_3760;
  initializer_list<int> local_3758;
  initializer_list<int> *local_3748;
  initializer_list<int> *__range1;
  hyper_log_log<int,_12UL> counter;
  int count;
  double error_count;
  int N;
  undefined1 local_2720 [8];
  mt19937 gen;
  random_device rd;
  
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar1 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2720,(ulong)rVar1);
  stack0xffffffffffffd8c8 = 0.0;
  counter.m_registers._M_elems[0xff8] = '\0';
  counter.m_registers._M_elems[0xff9] = '\0';
  counter.m_registers._M_elems[0xffa] = '\0';
  counter.m_registers._M_elems[0xffb] = '\0';
  memset((void *)((long)&__range1 + 4),0,0x1000);
  hll::hyper_log_log<int,_12UL>::hyper_log_log((hyper_log_log<int,_12UL> *)((long)&__range1 + 4));
  __begin1 = (const_iterator)0x3e800000064;
  local_3770 = 0x186a000002710;
  local_3768 = 0x989680000f4240;
  local_3760 = 0x3b9aca0005f5e100;
  local_3758._M_array = (iterator)&__begin1;
  local_3758._M_len = 8;
  local_3748 = &local_3758;
  __end1 = std::initializer_list<int>::begin(local_3748);
  piVar2 = std::initializer_list<int>::end(local_3748);
  for (; __end1 != piVar2; __end1 = __end1 + 1) {
    __b = *__end1;
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)
               ((long)&all._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),1,__b);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&value);
    for (local_37cc = 0; local_37cc < 1000000; local_37cc = local_37cc + 1) {
      local_37d0 = std::uniform_int_distribution<int>::operator()
                             ((uniform_int_distribution<int> *)
                              ((long)&all._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
                              (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)local_2720);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&value,&local_37d0);
      hll::hyper_log_log<int,_12UL>::add
                ((hyper_log_log<int,_12UL> *)((long)&__range1 + 4),&local_37d0);
    }
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&value);
    sVar4 = hll::hyper_log_log<int,_12UL>::count((hyper_log_log<int,_12UL> *)((long)&__range1 + 4));
    dVar5 = relative_error((int)sVar3,(int)sVar4);
    register0x00001200 = stack0xffffffffffffd8c8 + dVar5;
    counter.m_registers._M_elems._4088_4_ = counter.m_registers._M_elems._4088_4_ + 1;
    printf("%d numbers in range [1 .. %d], %d uniq, %d result, %.5f relative error\n",dVar5,1000000,
           (ulong)__b,sVar3 & 0xffffffff,sVar4 & 0xffffffff);
    hll::hyper_log_log<int,_12UL>::clear((hyper_log_log<int,_12UL> *)((long)&__range1 + 4));
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&value);
  }
  printf("Average error: %.5f\n",
         stack0xffffffffffffd8c8 / (double)(int)counter.m_registers._M_elems._4088_4_);
  dVar5 = hll::hyper_log_log<int,_12UL>::get_relative_error
                    ((hyper_log_log<int,_12UL> *)((long)&__range1 + 4));
  printf("Paper estimated error: %.5f\n",dVar5);
  std::random_device::~random_device((random_device *)&gen._M_p);
  return 0;
}

Assistant:

int main() {
    std::random_device rd;
    std::mt19937 gen(rd());

    constexpr int N = (int) 1e6;

    double error_count = 0.0;
    int count = 0;


    hll::hyper_log_log<int, 12> counter{};
    for (int k : {100, 1000, 10000, N / 10, N, N * 10, N * 100, N * 1000}) {
        std::uniform_int_distribution<> dis(1, k);
        std::set<int> all;

        for (int i = 0; i < N; i++) {
            int value = dis(gen);
            all.insert(value);
            counter.add(value);
        }
        int expected = (int) all.size();
        int counter_result = counter.count();
        double error = relative_error(expected, counter_result);
        error_count += error;
        count += 1;
        printf("%d numbers in range [1 .. %d], %d uniq, %d result, %.5f relative error\n", N, k, expected, counter_result, error);

        counter.clear();
    }

    printf("Average error: %.5f\n", error_count / count);
    printf("Paper estimated error: %.5f\n", counter.get_relative_error());
    return 0;
}